

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O3

golf_model_t * golf_data_get_model(char *path)

{
  golf_model_t *pgVar1;
  
  pgVar1 = (golf_model_t *)_golf_data_get_ptr(path,GOLF_DATA_MODEL);
  if (pgVar1 == (golf_model_t *)0x0) {
    golf_log_warning("Could not find model %s",path);
    pgVar1 = (golf_model_t *)_golf_data_get_ptr("data/models/cube.obj",GOLF_DATA_MODEL);
    if (pgVar1 == (golf_model_t *)0x0) {
      pgVar1 = (golf_model_t *)0x0;
      golf_log_error("Could not find fallback model");
    }
  }
  return pgVar1;
}

Assistant:

golf_model_t *golf_data_get_model(const char *path) {
    static const char *fallback = "data/models/cube.obj";

    golf_model_t *model = _golf_data_get_ptr(path, GOLF_DATA_MODEL);
    if (!model) {
        golf_log_warning("Could not find model %s", path);
        model = _golf_data_get_ptr(fallback, GOLF_DATA_MODEL);
        if (!model) {
            golf_log_error("Could not find fallback model");
        }
    }
    return model;
}